

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeCommandQueueExecuteCommandListsPrologue
          (ZEParameterValidation *this,ze_command_queue_handle_t hCommandQueue,
          uint32_t numCommandLists,ze_command_list_handle_t *phCommandLists,ze_fence_handle_t hFence
          )

{
  ze_result_t zVar1;
  
  if (hCommandQueue == (ze_command_queue_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (phCommandLists != (ze_command_list_handle_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_SIZE;
    if (numCommandLists != 0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeCommandQueueExecuteCommandListsPrologue(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of the command queue
        uint32_t numCommandLists,                       ///< [in] number of command lists to execute
        ze_command_list_handle_t* phCommandLists,       ///< [in][range(0, numCommandLists)] list of handles of the command lists
                                                        ///< to execute
        ze_fence_handle_t hFence                        ///< [in][optional] handle of the fence to signal on completion
        )
    {
        if( nullptr == hCommandQueue )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phCommandLists )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0 == numCommandLists )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        return ZE_RESULT_SUCCESS;
    }